

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnData::Filter
          (ColumnData *this,TransactionData transaction,idx_t vector_index,ColumnScanState *state,
          Vector *result,SelectionVector *sel,idx_t *s_count,TableFilter *filter,
          TableFilterState *filter_state)

{
  int iVar1;
  undefined4 extraout_var;
  UnifiedVectorFormat local_78;
  
  local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)transaction.start_time;
  local_78.sel = (SelectionVector *)transaction.transaction.ptr;
  local_78.data = (data_ptr_t)transaction.transaction_id;
  iVar1 = (*this->_vptr_ColumnData[9])();
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(result,CONCAT44(extraout_var,iVar1),&local_78);
  ColumnSegment::FilterSelection
            (sel,result,&local_78,filter,filter_state,CONCAT44(extraout_var,iVar1),s_count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ColumnData::Filter(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                        SelectionVector &sel, idx_t &s_count, const TableFilter &filter,
                        TableFilterState &filter_state) {
	idx_t scan_count = Scan(transaction, vector_index, state, result);

	UnifiedVectorFormat vdata;
	result.ToUnifiedFormat(scan_count, vdata);
	ColumnSegment::FilterSelection(sel, result, vdata, filter, filter_state, scan_count, s_count);
}